

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

size_t readInternal(size_t bufIndex,size_t nbChars)

{
  char *pcVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  ssize_t nbReadChars;
  size_t nbChars_local;
  size_t bufIndex_local;
  
  if (0x2a < bufIndex + nbChars) {
    __assert_fail("bufIndex + nbChars <= LEXER_BUF_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,800,"readInternal");
  }
  sVar2 = read((lexerState->field_2).field_1.fd,
               (void *)((long)&lexerState->field_2 + bufIndex + 0x10),nbChars);
  if (sVar2 == 0xffffffffffffffff) {
    pcVar1 = lexerState->path;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fatalerror("Error while reading \"%s\": %s\n",pcVar1,pcVar4);
  }
  return sVar2;
}

Assistant:

static size_t readInternal(size_t bufIndex, size_t nbChars)
{
	// This buffer overflow made me lose WEEKS of my life. Never again.
	assert(bufIndex + nbChars <= LEXER_BUF_SIZE);
	ssize_t nbReadChars = read(lexerState->fd, &lexerState->buf[bufIndex], nbChars);

	if (nbReadChars == -1)
		fatalerror("Error while reading \"%s\": %s\n", lexerState->path, strerror(errno));

	// `nbReadChars` cannot be negative, so it's fine to cast to `size_t`
	return (size_t)nbReadChars;
}